

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::incoming_connection_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,incoming_connection_alert *this)

{
  undefined8 uVar1;
  char *pcVar2;
  endpoint *in_RDX;
  allocator<char> local_2a5 [13];
  string local_298;
  char local_278 [8];
  char msg [600];
  incoming_connection_alert *this_local;
  
  libtorrent::aux::print_endpoint_abi_cxx11_(&local_298,(aux *)&this->endpoint,in_RDX);
  uVar1 = ::std::__cxx11::string::c_str();
  pcVar2 = socket_type_name(this->socket_type);
  snprintf(local_278,600,"incoming connection from %s (%s)",uVar1,pcVar2);
  ::std::__cxx11::string::~string((string *)&local_298);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,local_2a5);
  ::std::allocator<char>::~allocator(local_2a5);
  return __return_storage_ptr__;
}

Assistant:

std::string incoming_connection_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[600];
		std::snprintf(msg, sizeof(msg), "incoming connection from %s (%s)"
			, print_endpoint(endpoint).c_str(), socket_type_name(socket_type));
		return msg;
#endif
	}